

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::has_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  Decoration *dec;
  Meta *local_28;
  Meta *m;
  ExtendedDecorations decoration_local;
  uint32_t id_local;
  Compiler *this_local;
  
  m._0_4_ = decoration;
  m._4_4_ = id;
  _decoration_local = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&dec + 4),id);
  local_28 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  if (local_28 == (Meta *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = Bitset::get(&(local_28->decoration).extended.flags,(ExtendedDecorations)m);
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::has_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &dec = m->decoration;
	return dec.extended.flags.get(decoration);
}